

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttachedPart.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::AttachedPart::Encode(AttachedPart *this,KDataStream *stream)

{
  KDataStream::Write(stream,(this->super_VariableParameter).m_ui8VarParamType);
  KDataStream::Write(stream,this->m_ui8DetachedIndicator);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16PartAttachedToID);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32APPT);
  (*(this->m_AttachedPartType).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AttachedPartType,stream);
  return;
}

Assistant:

void AttachedPart::Encode( KDataStream & stream ) const
{
    stream << m_ui8VarParamType
           << m_ui8DetachedIndicator
           << m_ui16PartAttachedToID
           << m_ui32APPT
           << KDIS_STREAM m_AttachedPartType;
}